

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::ConfigBase::to_config
          (string *__return_storage_ptr__,ConfigBase *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  Option *this_00;
  App *pAVar1;
  size_type sVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  __type _Var7;
  ostream *poVar8;
  string *psVar9;
  size_t sVar10;
  uint uVar11;
  pointer ppAVar12;
  char *__s;
  uint uVar13;
  pointer ppAVar14;
  _Alloc_hider _Var15;
  App *pAVar16;
  pointer pbVar17;
  string single_name;
  string name;
  string value;
  string keyChars;
  string commentLead;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  string commentTest;
  string local_2d8;
  string local_2b8;
  _Any_data local_298;
  undefined8 local_288;
  undefined8 uStack_280;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  string local_218 [64];
  stringstream out;
  ostream local_1c8 [376];
  string local_50;
  
  uVar13 = (uint)write_description;
  uVar11 = (uint)default_also;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
  commentLead._M_dataplus._M_p = (pointer)&commentLead.field_2;
  commentLead._M_string_length = 0;
  commentLead.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&commentLead,this->commentChar);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&commentLead,' ');
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&commentTest,"#;",(allocator<char> *)&keyChars);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&commentTest,this->commentChar);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&commentTest,this->parentSeparatorChar);
  ::std::__cxx11::string::string((string *)&keyChars,&commentTest);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&keyChars,this->literalQuote);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&keyChars,this->stringQuote);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&keyChars,this->arrayStart);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&keyChars,this->arrayEnd);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&keyChars,this->valueDelimiter);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&keyChars,this->arraySeparator);
  App::get_groups_abi_cxx11_(&groups,app);
  pbVar17 = groups.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&single_name,"Options",(allocator<char> *)&value);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_insert_rval(&groups,(const_iterator)pbVar17,&single_name);
  ::std::__cxx11::string::~string((string *)&single_name);
  if ((write_description) &&
     (((app->configurable_ != false || (app->parent_ == (App *)0x0)) ||
      ((app->name_)._M_string_length == 0)))) {
    poVar8 = ::std::operator<<(local_1c8,(string *)&commentLead);
    ::std::__cxx11::string::string((string *)&local_278,&app->description_);
    CLI::detail::fix_newlines(&single_name,&commentLead,&local_278);
    poVar8 = ::std::operator<<(poVar8,(string *)&single_name);
    ::std::operator<<(poVar8,'\n');
    ::std::__cxx11::string::~string((string *)&single_name);
    ::std::__cxx11::string::~string((string *)&local_278);
  }
  bVar6 = false;
  pbVar17 = groups.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar17 ==
        groups.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      single_name.field_2._M_allocated_capacity = 0;
      single_name.field_2._8_8_ = 0;
      single_name._M_dataplus._M_p = (pointer)0x0;
      single_name._M_string_length = 0;
      App::get_subcommands(&subcommands,app,(function<bool_(const_CLI::App_*)> *)&single_name);
      std::_Function_base::~_Function_base((_Function_base *)&single_name);
      ppAVar12 = subcommands.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      for (ppAVar14 = subcommands.
                      super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppAVar14 != ppAVar12;
          ppAVar14 = ppAVar14 + 1) {
        pAVar1 = *ppAVar14;
        if (((pAVar1->name_)._M_string_length == 0) &&
           ((default_also || (sVar10 = App::count_all(pAVar1), sVar10 != 0)))) {
          if ((write_description) && ((pAVar1->group_)._M_string_length != 0)) {
            poVar8 = ::std::operator<<(local_1c8,'\n');
            poVar8 = ::std::operator<<(poVar8,(string *)&commentLead);
            poVar8 = ::std::operator<<(poVar8,(string *)&pAVar1->group_);
            ::std::operator<<(poVar8," Options\n");
          }
          ::std::__cxx11::string::string(local_218,prefix);
          (**(this->super_Config)._vptr_Config)
                    (&single_name,this,pAVar1,(ulong)uVar11,(ulong)uVar13,local_218);
          ::std::operator<<(local_1c8,(string *)&single_name);
          ::std::__cxx11::string::~string((string *)&single_name);
          ::std::__cxx11::string::~string(local_218);
        }
      }
      for (ppAVar12 = subcommands.
                      super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          ppAVar12 !=
          subcommands.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppAVar12 = ppAVar12 + 1) {
        pAVar1 = *ppAVar12;
        if (((pAVar1->name_)._M_string_length != 0) &&
           ((default_also || (sVar10 = App::count_all(pAVar1), sVar10 != 0)))) {
          ::std::__cxx11::string::string((string *)&single_name,&pAVar1->name_);
          clean_name_string(&single_name,&keyChars);
          if ((pAVar1->configurable_ == true) &&
             ((default_also || (bVar6 = App::got_subcommand(app,pAVar1), bVar6)))) {
            if ((prefix->_M_string_length == 0) && (app->parent_ != (App *)0x0)) {
              ::std::__cxx11::string::string((string *)&value,&app->name_);
              clean_name_string(&value,&keyChars);
              ::std::operator+(&local_2b8,&value,this->parentSeparatorChar);
              ::std::operator+(&name,&local_2b8,&single_name);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&single_name,&name);
              ::std::__cxx11::string::~string((string *)&name);
              ::std::__cxx11::string::~string((string *)&local_2b8);
              pAVar16 = app->parent_;
              while (pAVar16->parent_ != (App *)0x0) {
                ::std::__cxx11::string::string((string *)&name,&pAVar16->name_);
                clean_name_string(&name,&keyChars);
                ::std::operator+(&local_318,&name,this->parentSeparatorChar);
                ::std::operator+(&local_2b8,&local_318,&single_name);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&single_name,&local_2b8);
                ::std::__cxx11::string::~string((string *)&local_2b8);
                ::std::__cxx11::string::~string((string *)&local_318);
                pAVar16 = pAVar16->parent_;
                ::std::__cxx11::string::~string((string *)&name);
              }
              poVar8 = ::std::operator<<(local_1c8,'[');
              poVar8 = ::std::operator<<(poVar8,(string *)&single_name);
              ::std::operator<<(poVar8,"]\n");
              ::std::__cxx11::string::~string((string *)&value);
            }
            else {
              poVar8 = ::std::operator<<(local_1c8,'[');
              poVar8 = ::std::operator<<(poVar8,(string *)prefix);
              poVar8 = ::std::operator<<(poVar8,(string *)&single_name);
              ::std::operator<<(poVar8,"]\n");
            }
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_238,"",(allocator<char> *)&name);
            (**(this->super_Config)._vptr_Config)
                      (&value,this,pAVar1,(ulong)uVar11,(ulong)uVar13,&local_238);
            ::std::operator<<(local_1c8,(string *)&value);
            ::std::__cxx11::string::~string((string *)&value);
            psVar9 = &local_238;
          }
          else {
            ::std::operator+(&name,prefix,&single_name);
            ::std::operator+(&local_258,&name,this->parentSeparatorChar);
            (**(this->super_Config)._vptr_Config)
                      (&value,this,pAVar1,(ulong)uVar11,(ulong)uVar13,&local_258);
            ::std::operator<<(local_1c8,(string *)&value);
            ::std::__cxx11::string::~string((string *)&value);
            ::std::__cxx11::string::~string((string *)&local_258);
            psVar9 = &name;
          }
          ::std::__cxx11::string::~string((string *)psVar9);
          ::std::__cxx11::string::~string((string *)&single_name);
        }
      }
      ::std::__cxx11::stringbuf::str();
      std::_Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~_Vector_base
                (&subcommands.
                  super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&groups);
      ::std::__cxx11::string::~string((string *)&keyChars);
      ::std::__cxx11::string::~string((string *)&commentTest);
      ::std::__cxx11::string::~string((string *)&commentLead);
      ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
      return __return_storage_ptr__;
    }
    bVar5 = ::std::operator==(pbVar17,"Options");
    if (bVar5) {
      bVar5 = true;
      bVar4 = true;
      if (!bVar6) {
LAB_00175686:
        if (((write_description) && (bVar6 = ::std::operator==(pbVar17,"Options"), !bVar6)) &&
           (pbVar17->_M_string_length != 0)) {
          poVar8 = ::std::operator<<(local_1c8,'\n');
          poVar8 = ::std::operator<<(poVar8,(string *)&commentLead);
          poVar8 = ::std::operator<<(poVar8,(string *)pbVar17);
          ::std::operator<<(poVar8," Options\n");
        }
        local_298._M_unused._M_object = (void *)0x0;
        local_298._8_8_ = 0;
        local_288 = 0;
        uStack_280 = 0;
        App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                         &local_318,app,(function<bool_(const_CLI::Option_*)> *)&local_298);
        std::_Function_base::~_Function_base((_Function_base *)&local_298);
        sVar3 = local_318._M_string_length;
        for (_Var15._M_p = local_318._M_dataplus._M_p; _Var15._M_p != (pointer)sVar3;
            _Var15._M_p = _Var15._M_p + 8) {
          this_00 = *(Option **)_Var15._M_p;
          if (((this_00->super_OptionBase<CLI::Option>).configurable_ == true) &&
             ((_Var7 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)this_00,pbVar17), _Var7 ||
              ((bVar6 = ::std::operator==(pbVar17,"Options"), bVar6 &&
               ((this_00->super_OptionBase<CLI::Option>).group_._M_string_length == 0)))))) {
            psVar9 = Option::get_single_name_abi_cxx11_(this_00);
            ::std::__cxx11::string::string((string *)&single_name,psVar9);
            if (single_name._M_string_length != 0) {
              Option::reduced_results_abi_cxx11_((results_t *)&name,this_00);
              CLI::detail::ini_join
                        (&value,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&name,this->arraySeparator,this->arrayStart,this->arrayEnd,
                         this->stringQuote,this->literalQuote);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&name);
              if (value._M_string_length == 0 && default_also) {
                ::std::__cxx11::string::string((string *)&name,&this_00->default_str_);
                sVar2 = name._M_string_length;
                ::std::__cxx11::string::~string((string *)&name);
                if (sVar2 == 0) {
                  __s = "false";
                  if ((this_00->expected_min_ == 0) ||
                     (__s = "\"\"", this_00->run_callback_for_default_ == true)) {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::assign(&value,__s);
                  }
                }
                else {
                  ::std::__cxx11::string::string((string *)&local_2b8,&this_00->default_str_);
                  CLI::detail::convert_arg_for_ini
                            (&name,&local_2b8,this->stringQuote,this->literalQuote,false);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&value,&name);
                  ::std::__cxx11::string::~string((string *)&name);
                  ::std::__cxx11::string::~string((string *)&local_2b8);
                }
              }
              if (value._M_string_length != 0) {
                if ((this_00->fnames_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    (this_00->fnames_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  ::std::__cxx11::string::string((string *)&local_50,&value);
                  Option::get_flag_value(&name,this_00,&single_name,&local_50);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&value,&name);
                  ::std::__cxx11::string::~string((string *)&name);
                  ::std::__cxx11::string::~string((string *)&local_50);
                }
                if ((write_description) && ((this_00->description_)._M_string_length != 0)) {
                  ::std::operator<<(local_1c8,'\n');
                  poVar8 = ::std::operator<<(local_1c8,(string *)&commentLead);
                  ::std::__cxx11::string::string((string *)&local_2d8,&this_00->description_);
                  CLI::detail::fix_newlines(&name,&commentLead,&local_2d8);
                  poVar8 = ::std::operator<<(poVar8,(string *)&name);
                  ::std::operator<<(poVar8,'\n');
                  ::std::__cxx11::string::~string((string *)&name);
                  ::std::__cxx11::string::~string((string *)&local_2d8);
                }
                clean_name_string(&single_name,&keyChars);
                ::std::operator+(&name,prefix,&single_name);
                poVar8 = ::std::operator<<(local_1c8,(string *)&name);
                poVar8 = ::std::operator<<(poVar8,this->valueDelimiter);
                poVar8 = ::std::operator<<(poVar8,(string *)&value);
                ::std::operator<<(poVar8,'\n');
                ::std::__cxx11::string::~string((string *)&name);
              }
              ::std::__cxx11::string::~string((string *)&value);
            }
            ::std::__cxx11::string::~string((string *)&single_name);
          }
        }
        std::_Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~_Vector_base
                  ((_Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                   &local_318);
        bVar4 = bVar5;
      }
    }
    else {
      bVar5 = pbVar17->_M_string_length == 0;
      bVar4 = true;
      if (!(bool)(bVar5 & bVar6)) {
        bVar5 = (bool)(bVar5 | bVar6);
        goto LAB_00175686;
      }
    }
    bVar6 = bVar4;
    pbVar17 = pbVar17 + 1;
  } while( true );
}

Assistant:

CLI11_INLINE std::string
ConfigBase::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    std::string commentLead;
    commentLead.push_back(commentChar);
    commentLead.push_back(' ');

    std::string commentTest = "#;";
    commentTest.push_back(commentChar);
    commentTest.push_back(parentSeparatorChar);

    std::string keyChars = commentTest;
    keyChars.push_back(literalQuote);
    keyChars.push_back(stringQuote);
    keyChars.push_back(arrayStart);
    keyChars.push_back(arrayEnd);
    keyChars.push_back(valueDelimiter);
    keyChars.push_back(arraySeparator);

    std::vector<std::string> groups = app->get_groups();
    bool defaultUsed = false;
    groups.insert(groups.begin(), std::string("Options"));
    if(write_description && (app->get_configurable() || app->get_parent() == nullptr || app->get_name().empty())) {
        out << commentLead << detail::fix_newlines(commentLead, app->get_description()) << '\n';
    }
    for(auto &group : groups) {
        if(group == "Options" || group.empty()) {
            if(defaultUsed) {
                continue;
            }
            defaultUsed = true;
        }
        if(write_description && group != "Options" && !group.empty()) {
            out << '\n' << commentLead << group << " Options\n";
        }
        for(const Option *opt : app->get_options({})) {

            // Only process options that are configurable
            if(opt->get_configurable()) {
                if(opt->get_group() != group) {
                    if(!(group == "Options" && opt->get_group().empty())) {
                        continue;
                    }
                }
                std::string single_name = opt->get_single_name();
                if(single_name.empty()) {
                    continue;
                }

                std::string value = detail::ini_join(
                    opt->reduced_results(), arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);
                
                if(value.empty() && default_also) {
                    if(!opt->get_default_str().empty()) {
                        value = detail::convert_arg_for_ini(opt->get_default_str(), stringQuote, literalQuote, false);
                    } else if(opt->get_expected_min() == 0) {
                        value = "false";
                    } else if(opt->get_run_callback_for_default()) {
                        value = "\"\"";  // empty string default value
                    }
                }

                if(!value.empty()) {

                    if(!opt->get_fnames().empty()) {
                        try {
                            value = opt->get_flag_value(single_name, value);
                        } catch(const CLI::ArgumentMismatch &) {
                            bool valid{false};
                            for(const auto &test_name : opt->get_fnames()) {
                                try {
                                    value = opt->get_flag_value(test_name, value);
                                    single_name = test_name;
                                    valid = true;
                                } catch(const CLI::ArgumentMismatch &) {
                                    continue;
                                }
                            }
                            if(!valid) {
                                value = detail::ini_join(
                                    opt->results(), arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);
                            }
                        }
                    }
                    if(write_description && opt->has_description()) {
                        out << '\n';
                        out << commentLead << detail::fix_newlines(commentLead, opt->get_description()) << '\n';
                    }
                    clean_name_string(single_name, keyChars);

                    std::string name = prefix + single_name;

                    out << name << valueDelimiter << value << '\n';
                }
            }
        }
    }
    auto subcommands = app->get_subcommands({});
    for(const App *subcom : subcommands) {
        if(subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            if(write_description && !subcom->get_group().empty()) {
                out << '\n' << commentLead << subcom->get_group() << " Options\n";
            }
            /*if (!prefix.empty() || app->get_parent() == nullptr) {
                out << '[' << prefix << "___"<< subcom->get_group() << "]\n";
            } else {
                std::string subname = app->get_name() + parentSeparatorChar + "___"+subcom->get_group();
                const auto *p = app->get_parent();
                while(p->get_parent() != nullptr) {
                    subname = p->get_name() + parentSeparatorChar +subname;
                    p = p->get_parent();
                }
                out << '[' << subname << "]\n";
            }
            */
            out << to_config(subcom, default_also, write_description, prefix);
        }
    }

    for(const App *subcom : subcommands) {
        if(!subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            std::string subname = subcom->get_name();
            clean_name_string(subname, keyChars);

            if(subcom->get_configurable() && (default_also || app->got_subcommand(subcom))) {
                if(!prefix.empty() || app->get_parent() == nullptr) {

                    out << '[' << prefix << subname << "]\n";
                } else {
                    std::string appname = app->get_name();
                    clean_name_string(appname, keyChars);
                    subname = appname + parentSeparatorChar + subname;
                    const auto *p = app->get_parent();
                    while(p->get_parent() != nullptr) {
                        std::string pname = p->get_name();
                        clean_name_string(pname, keyChars);
                        subname = pname + parentSeparatorChar + subname;
                        p = p->get_parent();
                    }
                    out << '[' << subname << "]\n";
                }
                out << to_config(subcom, default_also, write_description, "");
            } else {
                out << to_config(subcom, default_also, write_description, prefix + subname + parentSeparatorChar);
            }
        }
    }

    return out.str();
}